

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

size_t google::protobuf::internal::WireFormat::ByteSize(Message *message)

{
  bool bVar1;
  MessageOptions *output;
  ulong uVar2;
  size_type sVar3;
  size_t sVar4;
  int i_1;
  int i;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  size_t our_size;
  Reflection *message_reflection;
  Descriptor *descriptor;
  Message *in_stack_ffffffffffffff38;
  Reflection *in_stack_ffffffffffffff40;
  UnknownFieldSet *in_stack_ffffffffffffff50;
  UnknownFieldSet *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int iVar5;
  Reflection *in_stack_ffffffffffffffb0;
  int local_48;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_38;
  size_t local_20;
  Reflection *local_18;
  Descriptor *local_10;
  
  local_10 = Message::GetDescriptor((Message *)in_stack_ffffffffffffff40);
  local_18 = Message::GetReflection((Message *)in_stack_ffffffffffffff40);
  local_20 = 0;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)0x47d462);
  output = Descriptor::options(local_10);
  bVar1 = MessageOptions::map_entry((MessageOptions *)0x47d480);
  if (bVar1) {
    for (local_48 = 0; iVar5 = Descriptor::field_count(local_10), local_48 < iVar5;
        local_48 = local_48 + 1) {
      Descriptor::field(local_10,local_48);
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)in_stack_ffffffffffffff40,(value_type *)in_stack_ffffffffffffff38);
    }
  }
  else {
    Reflection::ListFields
              (in_stack_ffffffffffffffb0,
               (Message *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)output);
  }
  for (iVar5 = 0; uVar2 = (ulong)iVar5,
      sVar3 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size(&local_38), uVar2 < sVar3; iVar5 = iVar5 + 1) {
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::operator[](&local_38,(long)iVar5);
    sVar4 = FieldByteSize((FieldDescriptor *)
                          CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                          (Message *)in_stack_ffffffffffffff60);
    local_20 = sVar4 + local_20;
  }
  Descriptor::options(local_10);
  bVar1 = MessageOptions::message_set_wire_format((MessageOptions *)0x47d5f4);
  if (bVar1) {
    Reflection::GetUnknownFields(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    sVar4 = ComputeUnknownMessageSetItemsSize(in_stack_ffffffffffffff50);
    local_20 = sVar4 + local_20;
  }
  else {
    in_stack_ffffffffffffff50 =
         Reflection::GetUnknownFields(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    sVar4 = ComputeUnknownFieldsSize(in_stack_ffffffffffffff60);
    local_20 = sVar4 + local_20;
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)in_stack_ffffffffffffff50);
  return local_20;
}

Assistant:

size_t WireFormat::ByteSize(const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* message_reflection = message.GetReflection();

  size_t our_size = 0;

  std::vector<const FieldDescriptor*> fields;

  // Fields of map entry should always be serialized.
  if (descriptor->options().map_entry()) {
    for (int i = 0; i < descriptor->field_count(); i++) {
      fields.push_back(descriptor->field(i));
    }
  } else {
    message_reflection->ListFields(message, &fields);
  }

  for (int i = 0; i < fields.size(); i++) {
    our_size += FieldByteSize(fields[i], message);
  }

  if (descriptor->options().message_set_wire_format()) {
    our_size += ComputeUnknownMessageSetItemsSize(
        message_reflection->GetUnknownFields(message));
  } else {
    our_size +=
        ComputeUnknownFieldsSize(message_reflection->GetUnknownFields(message));
  }

  return our_size;
}